

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O3

void * TPZParFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::WriteFile
                 (void *t)

{
  TPZManVector<TPZEqnArray<double>_*,_10> *copy;
  TPZEqnArray<double> *this;
  bool bVar1;
  int64_t iVar2;
  ostream *poVar3;
  long lVar4;
  TPZStackEqnStorage<double> *this_00;
  unique_lock<std::mutex> lock;
  TPZStack<TPZEqnArray<double>_*,_10> local;
  unique_lock<std::mutex> local_d0;
  unique_lock *local_c0;
  void *local_b8;
  _func_int **local_b0;
  mutex_type *local_a8;
  TPZManVector<TPZEqnArray<double>_*,_10> local_a0;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Entering Decomposition",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::ostream::flush();
  local_a8 = (mutex_type *)((long)t + 0x1fbd8);
  copy = (TPZManVector<TPZEqnArray<double>_*,_10> *)((long)t + 0x1fb60);
  local_c0 = (unique_lock *)((long)t + 0x1fc00);
  this_00 = (TPZStackEqnStorage<double> *)((long)t + 0x20);
  local_b0 = (_func_int **)&PTR__TPZManVector_019a1f40;
  local_b8 = t;
  do {
    local_a0.super_TPZVec<TPZEqnArray<double>_*>.fStore = local_a0.fExtAlloc;
    local_a0.super_TPZVec<TPZEqnArray<double>_*>.fNElements = 0;
    local_a0.super_TPZVec<TPZEqnArray<double>_*>.fNAlloc = 0;
    local_a0.super_TPZVec<TPZEqnArray<double>_*>._vptr_TPZVec = local_b0;
    local_d0._M_device = local_a8;
    local_d0._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_d0);
    local_d0._M_owns = true;
    if (*(long *)((long)t + 0x1fb70) == 0) {
      if (*(int *)((long)t + 130000) != 1) {
        std::condition_variable::wait(local_c0);
        goto LAB_013144e5;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Leaving WHILE",0xd);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      std::ostream::flush();
      std::unique_lock<std::mutex>::~unique_lock(&local_d0);
      bVar1 = false;
    }
    else {
LAB_013144e5:
      TPZManVector<TPZEqnArray<double>_*,_10>::operator=(&local_a0,copy);
      TPZManVector<TPZEqnArray<double>_*,_10>::Resize(copy,0);
      std::unique_lock<std::mutex>::~unique_lock(&local_d0);
      iVar2 = local_a0.super_TPZVec<TPZEqnArray<double>_*>.fNElements;
      bVar1 = true;
      if (0 < local_a0.super_TPZVec<TPZEqnArray<double>_*>.fNElements) {
        lVar4 = 0;
        do {
          TPZStackEqnStorage<double>::AddEqnArray
                    (this_00,local_a0.super_TPZVec<TPZEqnArray<double>_*>.fStore[lVar4]);
          this = local_a0.super_TPZVec<TPZEqnArray<double>_*>.fStore[lVar4];
          if (this != (TPZEqnArray<double> *)0x0) {
            TPZEqnArray<double>::~TPZEqnArray(this);
          }
          operator_delete(this,0x3290);
          lVar4 = lVar4 + 1;
          t = local_b8;
        } while (iVar2 != lVar4);
      }
    }
    if (local_a0.super_TPZVec<TPZEqnArray<double>_*>.fStore != local_a0.fExtAlloc) {
      local_a0.super_TPZVec<TPZEqnArray<double>_*>.fNAlloc = 0;
      local_a0.super_TPZVec<TPZEqnArray<double>_*>._vptr_TPZVec =
           (_func_int **)&PTR__TPZVec_019a1d08;
      if (local_a0.super_TPZVec<TPZEqnArray<double>_*>.fStore != (TPZEqnArray<double> **)0x0) {
        operator_delete__(local_a0.super_TPZVec<TPZEqnArray<double>_*>.fStore);
      }
    }
    if (!bVar1) {
      TPZStackEqnStorage<double>::FinishWriting(this_00);
      TPZStackEqnStorage<double>::ReOpen(this_00);
      *(undefined4 *)((long)t + 130000) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Terminating write thread\n",0x19);
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

void * TPZParFrontMatrix<TVar, store, front>::WriteFile(void *t){
	TPZParFrontMatrix<TVar, store, front> *parfront = (TPZParFrontMatrix<TVar, store, front>*) t;    
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Entering WriteFile thread execution";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	cout << endl << "Entering Decomposition" << endl;
	cout.flush();
	while(1){
		TPZStack<TPZEqnArray<TVar> *> local;
        {
            std::unique_lock<std::mutex> lock(parfront->fwritelock);
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Acquired writelock";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            if(parfront->fEqnStack.NElements() == 0){
                if(parfront->fFinish == 1) {
#ifdef PZ_LOG
                    if (logger.isDebugEnabled())
                    {
                        std::stringstream sout;
                        sout << "Terminating WriteFile thread execution";
                        LOGPZ_DEBUG(logger,sout.str())
                    }
#endif
                    cout << "Leaving WHILE" << endl;
                    cout.flush();
                    break;
                }
#ifdef PZ_LOG
                if (logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "Entering cond_wait on fwritecond variable";
                    LOGPZ_DEBUG(logger,sout.str())
                }
#endif
                parfront->fwritecond.wait(lock);
            }
            
            local = parfront->fEqnStack;
            parfront->fEqnStack.Resize(0);
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Copied the equation stack releasing the writelock";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            
        }
		int64_t neqn = local.NElements();

		int64_t eq;
		for(eq=0; eq<neqn; eq++) {
			parfront->fStorage.AddEqnArray(local[eq]);
			delete local[eq];
		}
	}
	parfront->fStorage.FinishWriting();
	parfront->fStorage.ReOpen();
	parfront->fFinish = 0;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Releasing writelock";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Falling through on the write thread";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	std::cout << "Terminating write thread\n";
	return (0);
}